

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_add_rel_pos_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *pw,ggml_tensor *ph,_Bool inplace)

{
  long lVar1;
  _Bool _Var2;
  ggml_tensor *pgVar3;
  char *pcVar4;
  int line;
  
  lVar1 = pw->ne[0];
  if ((((lVar1 == ph->ne[0]) && (pw->ne[1] == ph->ne[1])) && (pw->ne[2] == ph->ne[2])) &&
     (pw->ne[3] == ph->ne[3])) {
    _Var2 = ggml_is_contiguous_n(a,0);
    if (_Var2) {
      _Var2 = ggml_is_contiguous_n(pw,0);
      if (_Var2) {
        _Var2 = ggml_is_contiguous_n(ph,0);
        if (_Var2) {
          if (ph->type == GGML_TYPE_F32) {
            if (pw->type == GGML_TYPE_F32) {
              if (pw->ne[3] == a->ne[2]) {
                if (lVar1 * lVar1 - a->ne[0] == 0) {
                  if (pw->ne[2] * pw->ne[1] - a->ne[1] == 0) {
                    if (inplace) {
                      pgVar3 = ggml_view_tensor(ctx,a);
                    }
                    else {
                      pgVar3 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
                    }
                    pgVar3->op_params[0] = (uint)inplace;
                    pgVar3->op = GGML_OP_ADD_REL_POS;
                    pgVar3->src[0] = a;
                    pgVar3->src[1] = pw;
                    pgVar3->src[2] = ph;
                    return pgVar3;
                  }
                  pcVar4 = "pw->ne[1]*pw->ne[2] == a->ne[1]";
                  line = 0x1255;
                }
                else {
                  pcVar4 = "pw->ne[0]*pw->ne[0] == a->ne[0]";
                  line = 0x1254;
                }
              }
              else {
                pcVar4 = "pw->ne[3] == a->ne[2]";
                line = 0x1253;
              }
            }
            else {
              pcVar4 = "pw->type == GGML_TYPE_F32";
              line = 0x1252;
            }
          }
          else {
            pcVar4 = "ph->type == GGML_TYPE_F32";
            line = 0x1251;
          }
        }
        else {
          pcVar4 = "ggml_is_contiguous(ph)";
          line = 0x1250;
        }
      }
      else {
        pcVar4 = "ggml_is_contiguous(pw)";
        line = 0x124f;
      }
    }
    else {
      pcVar4 = "ggml_is_contiguous(a)";
      line = 0x124e;
    }
  }
  else {
    pcVar4 = "ggml_are_same_shape(pw, ph)";
    line = 0x124d;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

static struct ggml_tensor * ggml_add_rel_pos_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * pw,
        struct ggml_tensor  * ph,
        bool                  inplace) {
    GGML_ASSERT(ggml_are_same_shape(pw, ph));
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_is_contiguous(pw));
    GGML_ASSERT(ggml_is_contiguous(ph));
    GGML_ASSERT(ph->type == GGML_TYPE_F32);
    GGML_ASSERT(pw->type == GGML_TYPE_F32);
    GGML_ASSERT(pw->ne[3] == a->ne[2]);
    GGML_ASSERT(pw->ne[0]*pw->ne[0] == a->ne[0]);
    GGML_ASSERT(pw->ne[1]*pw->ne[2] == a->ne[1]);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);
    ggml_set_op_params_i32(result, 0, inplace ? 1 : 0);

    result->op     = GGML_OP_ADD_REL_POS;
    result->src[0] = a;
    result->src[1] = pw;
    result->src[2] = ph;

    return result;
}